

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5MergePrefixLists(Fts5Index *p,Fts5Buffer *p1,int nBuf,Fts5Buffer *aBuf)

{
  int iVar1;
  u8 *puVar2;
  long lVar3;
  Fts5Buffer *pFVar4;
  int iVar5;
  Fts5DoclistIter *pFVar6;
  int *piVar7;
  Fts5DoclistIter *pFVar8;
  Fts5DoclistIter *pFVar9;
  Fts5DoclistIter *pFVar10;
  Fts5DoclistIter *pFVar11;
  int iVar12;
  long lVar13;
  PrefixMerger *pThis;
  size_t __n;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long in_FS_OFFSET;
  PrefixMerger *pHead;
  i64 iPrev;
  Fts5Buffer tmp;
  Fts5Buffer out;
  PrefixMerger aMerger [16];
  Fts5DoclistIter *local_498;
  Fts5Index *local_490;
  ulong local_488;
  Fts5Buffer *local_480;
  long local_478;
  ulong local_470;
  long local_468;
  u8 *local_460;
  Fts5Buffer local_458;
  Fts5Buffer local_448;
  Fts5DoclistIter local_438;
  long local_400 [121];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_490 = p;
  memset(&local_438,0xaa,0x400);
  local_498 = (Fts5DoclistIter *)0x0;
  local_448.p = (u8 *)0x0;
  local_448.n = 0;
  local_448.nSpace = 0;
  local_458.p = (u8 *)0x0;
  local_458.n = 0;
  local_458.nSpace = 0;
  lVar14 = (long)nBuf;
  iVar12 = 0;
  local_488 = (ulong)(uint)nBuf;
  __memset_chk(&local_438,0,lVar14 * 0x40 + 0x40,0x400);
  local_498 = &local_438 + lVar14 * 2;
  local_498->aEof = (u8 *)0x0;
  (&local_438)[lVar14 * 2].iRowid = 0;
  (&local_438)[lVar14 * 2].aPoslist = (u8 *)0x0;
  (&local_438)[lVar14 * 2].nPoslist = 0;
  (&local_438)[lVar14 * 2].nSize = 0;
  iVar5 = p1->n;
  if (0 < (long)iVar5) {
    puVar2 = p1->p;
    (&local_438)[lVar14 * 2].aPoslist = puVar2;
    local_498->aEof = puVar2 + iVar5;
    fts5DoclistIterNext(local_498);
  }
  local_480 = p1;
  if (0 < (int)local_488) {
    uVar16 = local_488 & 0xffffffff;
    uVar15 = 0;
    iVar12 = 0;
    do {
      pFVar10 = &local_438 + uVar15 * 2;
      (&local_438)[uVar15 * 2].aPoslist = (u8 *)0x0;
      (&local_438)[uVar15 * 2].nPoslist = 0;
      (&local_438)[uVar15 * 2].nSize = 0;
      pFVar10->aEof = (u8 *)0x0;
      (&local_438)[uVar15 * 2].iRowid = 0;
      iVar5 = aBuf[uVar15].n;
      if (0 < (long)iVar5) {
        puVar2 = aBuf[uVar15].p;
        (&local_438)[uVar15 * 2].aPoslist = puVar2;
        pFVar10->aEof = puVar2 + iVar5;
        fts5DoclistIterNext(pFVar10);
      }
      if ((&local_438)[uVar15 * 2].aPoslist != (u8 *)0x0) {
        pFVar6 = local_498;
        piVar7 = (int *)&local_498;
        if ((local_498 != (Fts5DoclistIter *)0x0) &&
           (piVar7 = (int *)&local_498, local_498->iRowid < (&local_438)[uVar15 * 2].iRowid)) {
          do {
            pFVar11 = pFVar6;
            pFVar6 = *(Fts5DoclistIter **)&pFVar11[1].nPoslist;
            if (pFVar6 == (Fts5DoclistIter *)0x0) break;
          } while (pFVar6->iRowid < (&local_438)[uVar15 * 2].iRowid);
          piVar7 = &pFVar11[1].nPoslist;
        }
        local_400[uVar15 * 8] = (long)pFVar6;
        *(Fts5DoclistIter **)piVar7 = pFVar10;
      }
      iVar12 = iVar12 + aBuf[uVar15].n;
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar16);
  }
  if (iVar12 != 0) {
    local_490 = (Fts5Index *)&local_490->rc;
    iVar5 = sqlite3Fts5BufferSize
                      ((int *)local_490,&local_448,local_480->n + iVar12 + (int)local_488 * 10 + 9);
    if (iVar5 == 0) {
      if (local_498 != (Fts5DoclistIter *)0x0) {
        local_470 = (ulong)((int)local_488 + 1);
        lVar14 = 0;
        do {
          puVar2 = local_448.p;
          pFVar10 = local_498;
          lVar13 = (long)local_448.n;
          iVar5 = sqlite3Fts5PutVarint(local_448.p + lVar13,local_498->iRowid - lVar14);
          lVar13 = iVar5 + lVar13;
          iVar5 = (int)lVar13;
          local_448.n = iVar5;
          lVar14 = pFVar10->iRowid;
          if ((*(long *)&pFVar10[1].nPoslist != 0) &&
             (lVar14 == *(long *)(*(long *)&pFVar10[1].nPoslist + 8))) {
            iVar12 = 0;
            local_460 = (u8 *)0x0;
            local_498 = (Fts5DoclistIter *)0x0;
            iVar5 = 8;
            local_478 = lVar14;
            local_468 = lVar13;
            do {
              pFVar6 = pFVar10;
              if (pFVar10->iRowid != local_478) break;
              pFVar6 = *(Fts5DoclistIter **)&pFVar10[1].nPoslist;
              *(undefined4 *)&pFVar10[1].iRowid = 0;
              pFVar10[1].aEof = (u8 *)0x0;
              iVar1 = pFVar10->nSize;
              pFVar10[1].aPoslist = pFVar10->aPoslist + iVar1;
              sqlite3Fts5PoslistNext64
                        (pFVar10->aPoslist + iVar1,pFVar10->nPoslist,(int *)&pFVar10[1].iRowid,
                         (i64 *)(pFVar10 + 1));
              iVar1 = pFVar10->nPoslist;
              puVar2 = pFVar10[1].aEof;
              if (-1 < (long)puVar2) {
                pFVar11 = local_498;
                piVar7 = (int *)&local_498;
                if ((local_498 != (Fts5DoclistIter *)0x0) &&
                   (piVar7 = (int *)&local_498, (long)local_498[1].aEof < (long)puVar2)) {
                  do {
                    pFVar9 = pFVar11;
                    pFVar11 = *(Fts5DoclistIter **)&pFVar9[1].nPoslist;
                    if (pFVar11 == (Fts5DoclistIter *)0x0) break;
                  } while ((long)pFVar11[1].aEof < (long)puVar2);
                  piVar7 = &pFVar9[1].nPoslist;
                }
                *(Fts5DoclistIter **)&pFVar10[1].nPoslist = pFVar11;
                *(Fts5DoclistIter **)piVar7 = pFVar10;
              }
              iVar5 = iVar5 + iVar1 + 10;
              iVar12 = iVar12 + 1;
              pFVar10 = pFVar6;
            } while (pFVar6 != (Fts5DoclistIter *)0x0);
            pFVar10 = local_498;
            if ((local_498 != (Fts5DoclistIter *)0x0) &&
               (lVar14._0_4_ = local_498[1].nPoslist, lVar14._4_4_ = local_498[1].nSize, lVar14 != 0
               )) {
              iVar12 = sqlite3Fts5BufferSize((int *)local_490,&local_458,iVar5 + iVar12 * 10);
              if (iVar12 != 0) break;
              local_458._8_8_ = local_458._8_8_ & 0xffffffff00000000;
              pFVar11 = *(Fts5DoclistIter **)&pFVar10[1].nPoslist;
              local_498 = pFVar11;
              sqlite3Fts5PoslistSafeAppend(&local_458,(i64 *)&local_460,(i64)pFVar10[1].aEof);
              sqlite3Fts5PoslistNext64
                        (pFVar10[1].aPoslist,pFVar10->nPoslist,(int *)&pFVar10[1].iRowid,
                         (i64 *)(pFVar10 + 1));
              puVar2 = pFVar10[1].aEof;
              if (-1 < (long)puVar2) {
                piVar7 = (int *)&local_498;
                if ((pFVar11 != (Fts5DoclistIter *)0x0) &&
                   (piVar7 = (int *)&local_498, (long)pFVar11[1].aEof < (long)puVar2)) {
                  do {
                    pFVar9 = pFVar11;
                    pFVar11 = *(Fts5DoclistIter **)&pFVar9[1].nPoslist;
                    if (pFVar11 == (Fts5DoclistIter *)0x0) break;
                  } while ((long)pFVar11[1].aEof < (long)puVar2);
                  piVar7 = &pFVar9[1].nPoslist;
                }
                *(Fts5DoclistIter **)&pFVar10[1].nPoslist = pFVar11;
                *(Fts5DoclistIter **)piVar7 = pFVar10;
              }
              lVar13._0_4_ = local_498[1].nPoslist;
              lVar13._4_4_ = local_498[1].nSize;
              if (lVar13 != 0) {
                do {
                  pFVar11 = local_498;
                  pFVar10 = local_498 + 1;
                  if (local_498[1].aEof != local_460) {
                    sqlite3Fts5PoslistSafeAppend
                              (&local_458,(i64 *)&local_460,(i64)local_498[1].aEof);
                  }
                  sqlite3Fts5PoslistNext64
                            (pFVar11[1].aPoslist,pFVar11->nPoslist,(int *)&pFVar11[1].iRowid,
                             (i64 *)(pFVar11 + 1));
                  local_498 = *(Fts5DoclistIter **)&pFVar10->nPoslist;
                  puVar2 = pFVar11[1].aEof;
                  if (-1 < (long)puVar2) {
                    pFVar9 = local_498;
                    piVar7 = (int *)&local_498;
                    if ((local_498 != (Fts5DoclistIter *)0x0) &&
                       (piVar7 = (int *)&local_498, (long)local_498[1].aEof < (long)puVar2)) {
                      do {
                        pFVar8 = pFVar9;
                        pFVar9 = *(Fts5DoclistIter **)&pFVar8[1].nPoslist;
                        if (pFVar9 == (Fts5DoclistIter *)0x0) break;
                      } while ((long)pFVar9[1].aEof < (long)puVar2);
                      piVar7 = &pFVar8[1].nPoslist;
                    }
                    *(Fts5DoclistIter **)&pFVar10->nPoslist = pFVar9;
                    *(Fts5DoclistIter **)piVar7 = pFVar11;
                  }
                  lVar3._0_4_ = local_498[1].nPoslist;
                  lVar3._4_4_ = local_498[1].nSize;
                } while (lVar3 != 0);
              }
              pFVar10 = local_498;
              if (local_498[1].aEof != local_460) {
                sqlite3Fts5PoslistSafeAppend(&local_458,(i64 *)&local_460,(i64)local_498[1].aEof);
              }
              puVar2 = local_448.p;
              lVar14 = local_468;
              uVar16 = (long)pFVar10->nPoslist - (long)(int)pFVar10[1].iRowid;
              if ((int)((long)local_458.n + uVar16) <= iVar5 + -8) {
                iVar5 = sqlite3Fts5PutVarint
                                  (local_448.p + local_468,((long)local_458.n + uVar16) * 2);
                iVar5 = iVar5 + (int)lVar14;
                __n = (size_t)local_458.n;
                local_448.n = iVar5;
                memcpy(puVar2 + iVar5,local_458.p,__n);
                lVar14 = __n + (long)iVar5;
                iVar5 = (int)lVar14;
                local_448.n = iVar5;
                if (0 < (int)uVar16) {
                  memcpy(puVar2 + lVar14,pFVar10[1].aPoslist + (int)pFVar10[1].iRowid,
                         uVar16 & 0xffffffff);
                  local_448.n = (int)uVar16 + iVar5;
                }
                uVar16 = local_470;
                lVar14 = local_478;
                local_498 = pFVar6;
                if (-1 < (int)local_488) {
                  uVar15 = 0;
                  do {
                    if ((((&local_438)[uVar15 * 2].aPoslist != (u8 *)0x0) &&
                        ((&local_438)[uVar15 * 2].iRowid == lVar14)) &&
                       (fts5DoclistIterNext(&local_438 + uVar15 * 2),
                       (&local_438)[uVar15 * 2].aPoslist != (u8 *)0x0)) {
                      pFVar10 = local_498;
                      piVar7 = (int *)&local_498;
                      if ((local_498 != (Fts5DoclistIter *)0x0) &&
                         (piVar7 = (int *)&local_498,
                         local_498->iRowid < (&local_438)[uVar15 * 2].iRowid)) {
                        do {
                          pFVar6 = pFVar10;
                          pFVar10 = *(Fts5DoclistIter **)&pFVar6[1].nPoslist;
                          if (pFVar10 == (Fts5DoclistIter *)0x0) break;
                        } while (pFVar10->iRowid < (&local_438)[uVar15 * 2].iRowid);
                        piVar7 = &pFVar6[1].nPoslist;
                      }
                      local_400[uVar15 * 8] = (long)pFVar10;
                      *(Fts5DoclistIter **)piVar7 = &local_438 + uVar15 * 2;
                    }
                    uVar15 = uVar15 + 1;
                  } while (uVar15 != uVar16);
                }
                goto LAB_001ebbf3;
              }
              if (*(int *)&local_490->pConfig != 0) break;
            }
            *(undefined4 *)&local_490->pConfig = 0x10b;
            break;
          }
          memcpy(puVar2 + iVar5,pFVar10->aPoslist,(long)pFVar10->nSize + (long)pFVar10->nPoslist);
          local_448.n = pFVar10->nPoslist + iVar5 + pFVar10->nSize;
          fts5DoclistIterNext(pFVar10);
          local_498 = *(Fts5DoclistIter **)&pFVar10[1].nPoslist;
          if (pFVar10->aPoslist != (u8 *)0x0) {
            pFVar6 = local_498;
            piVar7 = (int *)&local_498;
            if ((local_498 != (Fts5DoclistIter *)0x0) &&
               (piVar7 = (int *)&local_498, local_498->iRowid < pFVar10->iRowid)) {
              do {
                pFVar11 = pFVar6;
                pFVar6 = *(Fts5DoclistIter **)&pFVar11[1].nPoslist;
                if (pFVar6 == (Fts5DoclistIter *)0x0) break;
              } while (pFVar6->iRowid < pFVar10->iRowid);
              piVar7 = &pFVar11[1].nPoslist;
            }
            *(Fts5DoclistIter **)&pFVar10[1].nPoslist = pFVar6;
            *(Fts5DoclistIter **)piVar7 = pFVar10;
          }
LAB_001ebbf3:
        } while (local_498 != (Fts5DoclistIter *)0x0);
      }
      pFVar4 = local_480;
      sqlite3_free(local_480->p);
      pFVar4->p = (u8 *)0x0;
      pFVar4->n = 0;
      pFVar4->nSpace = 0;
      sqlite3_free(local_458.p);
      local_458.p = (u8 *)0x0;
      local_458.n = 0;
      local_458.nSpace = 0;
      puVar2 = local_448.p + local_448.n;
      puVar2[0] = '\0';
      puVar2[1] = '\0';
      puVar2[2] = '\0';
      puVar2[3] = '\0';
      puVar2[4] = '\0';
      puVar2[5] = '\0';
      puVar2[6] = '\0';
      puVar2[7] = '\0';
      pFVar4->p = local_448.p;
      pFVar4->n = local_448.n;
      pFVar4->nSpace = local_448.nSpace;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fts5MergePrefixLists(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5Buffer *p1,                 /* First list to merge */
  int nBuf,                       /* Number of buffers in array aBuf[] */
  Fts5Buffer *aBuf                /* Other lists to merge in */
){
#define fts5PrefixMergerNextPosition(p) \
  sqlite3Fts5PoslistNext64((p)->aPos,(p)->iter.nPoslist,&(p)->iOff,&(p)->iPos)
#define FTS5_MERGE_NLIST 16
  PrefixMerger aMerger[FTS5_MERGE_NLIST];
  PrefixMerger *pHead = 0;
  int i;
  int nOut = 0;
  Fts5Buffer out = {0, 0, 0};
  Fts5Buffer tmp = {0, 0, 0};
  i64 iLastRowid = 0;

  /* Initialize a doclist-iterator for each input buffer. Arrange them in
  ** a linked-list starting at pHead in ascending order of rowid. Avoid
  ** linking any iterators already at EOF into the linked list at all. */
  assert( nBuf+1<=(int)(sizeof(aMerger)/sizeof(aMerger[0])) );
  memset(aMerger, 0, sizeof(PrefixMerger)*(nBuf+1));
  pHead = &aMerger[nBuf];
  fts5DoclistIterInit(p1, &pHead->iter);
  for(i=0; i<nBuf; i++){
    fts5DoclistIterInit(&aBuf[i], &aMerger[i].iter);
    fts5PrefixMergerInsertByRowid(&pHead, &aMerger[i]);
    nOut += aBuf[i].n;
  }
  if( nOut==0 ) return;
  nOut += p1->n + 9 + 10*nBuf;

  /* The maximum size of the output is equal to the sum of the
  ** input sizes + 1 varint (9 bytes). The extra varint is because if the
  ** first rowid in one input is a large negative number, and the first in
  ** the other a non-negative number, the delta for the non-negative
  ** number will be larger on disk than the literal integer value
  ** was.
  **
  ** Or, if the input position-lists are corrupt, then the output might
  ** include up to (nBuf+1) extra 10-byte positions created by interpreting -1
  ** (the value PoslistNext64() uses for EOF) as a position and appending
  ** it to the output. This can happen at most once for each input
  ** position-list, hence (nBuf+1) 10 byte paddings.  */
  if( sqlite3Fts5BufferSize(&p->rc, &out, nOut) ) return;

  while( pHead ){
    fts5MergeAppendDocid(&out, iLastRowid, pHead->iter.iRowid);

    if( pHead->pNext && iLastRowid==pHead->pNext->iter.iRowid ){
      /* Merge data from two or more poslists */
      i64 iPrev = 0;
      int nTmp = FTS5_DATA_ZERO_PADDING;
      int nMerge = 0;
      PrefixMerger *pSave = pHead;
      PrefixMerger *pThis = 0;
      int nTail = 0;

      pHead = 0;
      while( pSave && pSave->iter.iRowid==iLastRowid ){
        PrefixMerger *pNext = pSave->pNext;
        pSave->iOff = 0;
        pSave->iPos = 0;
        pSave->aPos = &pSave->iter.aPoslist[pSave->iter.nSize];
        fts5PrefixMergerNextPosition(pSave);
        nTmp += pSave->iter.nPoslist + 10;
        nMerge++;
        fts5PrefixMergerInsertByPosition(&pHead, pSave);
        pSave = pNext;
      }

      if( pHead==0 || pHead->pNext==0 ){
        p->rc = FTS5_CORRUPT;
        break;
      }

      /* See the earlier comment in this function for an explanation of why
      ** corrupt input position lists might cause the output to consume
      ** at most nMerge*10 bytes of unexpected space. */
      if( sqlite3Fts5BufferSize(&p->rc, &tmp, nTmp+nMerge*10) ){
        break;
      }
      fts5BufferZero(&tmp);

      pThis = pHead;
      pHead = pThis->pNext;
      sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, pThis->iPos);
      fts5PrefixMergerNextPosition(pThis);
      fts5PrefixMergerInsertByPosition(&pHead, pThis);

      while( pHead->pNext ){
        pThis = pHead;
        if( pThis->iPos!=iPrev ){
          sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, pThis->iPos);
        }
        fts5PrefixMergerNextPosition(pThis);
        pHead = pThis->pNext;
        fts5PrefixMergerInsertByPosition(&pHead, pThis);
      }

      if( pHead->iPos!=iPrev ){
        sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, pHead->iPos);
      }
      nTail = pHead->iter.nPoslist - pHead->iOff;

      /* WRITEPOSLISTSIZE */
      assert_nc( tmp.n+nTail<=nTmp );
      assert( tmp.n+nTail<=nTmp+nMerge*10 );
      if( tmp.n+nTail>nTmp-FTS5_DATA_ZERO_PADDING ){
        if( p->rc==SQLITE_OK ) p->rc = FTS5_CORRUPT;
        break;
      }
      fts5BufferSafeAppendVarint(&out, (tmp.n+nTail) * 2);
      fts5BufferSafeAppendBlob(&out, tmp.p, tmp.n);
      if( nTail>0 ){
        fts5BufferSafeAppendBlob(&out, &pHead->aPos[pHead->iOff], nTail);
      }

      pHead = pSave;
      for(i=0; i<nBuf+1; i++){
        PrefixMerger *pX = &aMerger[i];
        if( pX->iter.aPoslist && pX->iter.iRowid==iLastRowid ){
          fts5DoclistIterNext(&pX->iter);
          fts5PrefixMergerInsertByRowid(&pHead, pX);
        }
      }

    }else{
      /* Copy poslist from pHead to output */
      PrefixMerger *pThis = pHead;
      Fts5DoclistIter *pI = &pThis->iter;
      fts5BufferSafeAppendBlob(&out, pI->aPoslist, pI->nPoslist+pI->nSize);
      fts5DoclistIterNext(pI);
      pHead = pThis->pNext;
      fts5PrefixMergerInsertByRowid(&pHead, pThis);
    }
  }

  fts5BufferFree(p1);
  fts5BufferFree(&tmp);
  memset(&out.p[out.n], 0, FTS5_DATA_ZERO_PADDING);
  *p1 = out;
}